

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O1

void __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::render_current_line
          (basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
           *this,render_handler *handler,
          context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          *ctx,component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               *comp)

{
  int iVar1;
  size_type sVar2;
  long lVar3;
  bool bVar4;
  
  if ((ctx->line_buffer).contained_section_tag == true) {
    sVar2 = (ctx->line_buffer).data._M_string_length;
    bVar4 = sVar2 == 0;
    if (!bVar4) {
      lVar3 = 0;
      do {
        iVar1 = *(int *)((long)(ctx->line_buffer).data._M_dataplus._M_p + lVar3);
        if ((iVar1 != 0x20) && (iVar1 != 9)) break;
        lVar3 = lVar3 + 4;
        bVar4 = sVar2 << 2 == lVar3;
      } while (!bVar4);
    }
    if (bVar4) goto LAB_001e6638;
  }
  if ((handler->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*handler->_M_invoker)((_Any_data *)handler,&(ctx->line_buffer).data);
    if (comp != (component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                 *)0x0) {
      if ((handler->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_001e6654;
      (*handler->_M_invoker)((_Any_data *)handler,&comp->text);
    }
LAB_001e6638:
    (ctx->line_buffer).data._M_string_length = 0;
    *(ctx->line_buffer).data._M_dataplus._M_p = L'\0';
    (ctx->line_buffer).contained_section_tag = false;
    return;
  }
LAB_001e6654:
  std::__throw_bad_function_call();
}

Assistant:

void render_current_line(const render_handler& handler, context_internal<string_type>& ctx, const component<string_type>* comp) const {
        // We're at the end of a line, so check the line buffer state to see
        // if the line had tags in it, and also if the line is now empty or
        // contains whitespace only. if this situation is true, skip the line.
        bool output = true;
        if (ctx.line_buffer.contained_section_tag && ctx.line_buffer.is_empty_or_contains_only_whitespace()) {
            output = false;
        }
        if (output) {
            handler(ctx.line_buffer.data);
            if (comp) {
                handler(comp->text);
            }
        }
        ctx.line_buffer.clear();
    }